

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functions.c
# Opt level: O2

double Jupiter_strtod_nospace(char *str)

{
  byte bVar1;
  int iVar2;
  char *str_00;
  double dVar3;
  double dVar4;
  
  if (*str == '+') {
    str = str + 1;
  }
  else if (*str == '-') {
    dVar3 = Jupiter_strtod_nospace(str + 1);
    return -dVar3;
  }
  str_00 = str + 2;
  dVar3 = 0.0;
  while( true ) {
    bVar1 = str_00[-2];
    if ((ulong)bVar1 - 0x3a < 0xfffffffffffffff6) break;
    dVar3 = dVar3 * 10.0 +
            (double)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                    [bVar1];
    str_00 = str_00 + 1;
  }
  if (bVar1 == 0x2e) {
    iVar2 = 10;
    while( true ) {
      bVar1 = str_00[-1];
      if ((ulong)bVar1 - 0x3a < 0xfffffffffffffff6) break;
      dVar3 = dVar3 + (double)"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                              [bVar1] / (double)iVar2;
      iVar2 = iVar2 * 10;
      str_00 = str_00 + 1;
    }
    if ((bVar1 | 0x20) == 0x65) {
      iVar2 = Jupiter_strtoi_nospace(str_00,10);
      dVar4 = pow(10.0,(double)iVar2);
      dVar3 = dVar3 * dVar4;
    }
  }
  return dVar3;
}

Assistant:

double Jupiter_strtod_nospace(const char *str)
{
	const int base = 10;
	double total = 0.0;
	double decimal = 0.0;
	int tval;

	if (*str == '-')
		return -1 * Jupiter_strtod_nospace(++str);

	if (*str == '+')
		++str;

	while ((tval = Jupiter_getBase(*str, base)) != -1)
	{
		total = base * total + tval;
		++str;
	}

	if (*str == '.')
	{
		++str;
		tval = base;
		while ((decimal = Jupiter_getBase(*str, base)) != -1)
		{
			total = total + (decimal / tval);
			++str;
			tval = tval * base;
		}
		if (*str == 'e' || *str == 'E')
			total = total * pow(base, Jupiter_strtoi_nospace(++str, 10));
	}

	return total;
}